

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O2

nng_err http_entity_alloc_data(nni_http_entity *entity,size_t size)

{
  nng_err nVar1;
  char *pcVar2;
  
  pcVar2 = (char *)nni_zalloc(size);
  if (pcVar2 == (char *)0x0) {
    nVar1 = NNG_ENOMEM;
  }
  else {
    if (entity->own == true) {
      nni_free(entity->data,entity->size);
    }
    entity->data = pcVar2;
    entity->size = size;
    entity->own = true;
    nVar1 = NNG_OK;
  }
  return nVar1;
}

Assistant:

static nng_err
http_entity_alloc_data(nni_http_entity *entity, size_t size)
{
	void *newdata;
	if (size != 0) {
		if ((newdata = nni_zalloc(size)) == NULL) {
			return (NNG_ENOMEM);
		}
	}
	http_entity_set_data(entity, newdata, size);
	entity->own = true;
	return (NNG_OK);
}